

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brg_sha1.c
# Opt level: O2

void rng_init(RNG_state *newstate,int seed)

{
  int i;
  long lVar1;
  state_t gen;
  sha1_ctx local_78;
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    gen.state[lVar1] = '\0';
  }
  gen.state._16_4_ =
       (uint)seed >> 0x18 | (seed & 0xff0000U) >> 8 | (seed & 0xff00U) << 8 | seed << 0x18;
  local_78.count[0] = 0;
  local_78.count[1] = 0;
  local_78.hash[0] = 0x67452301;
  local_78.hash[1] = 0xefcdab89;
  local_78.hash[2] = 0x98badcfe;
  local_78.hash[3] = 0x10325476;
  local_78.hash[4] = 0xc3d2e1f0;
  sha1_hash(gen.state,0x14,&local_78);
  sha1_end(newstate,&local_78);
  return;
}

Assistant:

void rng_init(RNG_state *newstate, int seed)
{
  struct sha1_context ctx;
  struct state_t gen;
  int i;

  for (i=0; i < 16; i++) 
    gen.state[i] = 0;
  gen.state[16] = 0xFF & (seed >> 24);
  gen.state[17] = 0xFF & (seed >> 16);
  gen.state[18] = 0xFF & (seed >> 8);
  gen.state[19] = 0xFF & (seed >> 0);
  
  sha1_begin(&ctx);
  sha1_hash(gen.state, 20, &ctx);
  sha1_end(newstate, &ctx);
}